

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::MakeDirectory(char *path)

{
  allocator local_39;
  string local_38;
  char *local_18;
  char *path_local;
  
  if (path == (char *)0x0) {
    path_local._7_1_ = 0;
  }
  else {
    local_18 = path;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,path,&local_39);
    path_local._7_1_ = MakeDirectory(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool SystemTools::MakeDirectory(const char* path)
{
  if(!path)
    {
    return false;
    }
  return SystemTools::MakeDirectory(std::string(path));
}